

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::HandleLevel3
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  bool bVar1;
  static_string_view keyword;
  CurrentAndNextIter args;
  CurrentAndNextIter local_38;
  
  local_38 = cmArgumentList::make2ArgsIterator(newArgs);
  while (local_38.next._M_node != (_List_node_base *)newArgs) {
    keyword.super_string_view._M_str = DAT_009bd098;
    keyword.super_string_view._M_len = (anonymous_namespace)::keyNOT;
    bVar1 = IsKeyword(this,keyword,(cmExpandedCommandArgument *)(local_38.current._M_node + 1));
    if (bVar1) {
      bVar1 = GetBooleanValueWithAutoDereference
                        (this,(cmExpandedCommandArgument *)(local_38.next._M_node + 1),errorString,
                         status,false);
      cmArgumentList::ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndNextIter>
                (newArgs,!bVar1,local_38);
    }
    cmArgumentList::CurrentAndNextIter::advance
              (&local_38,
               &newArgs->
                super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>);
  }
  return true;
}

Assistant:

bool cmConditionEvaluator::HandleLevel3(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        MessageType& status)
{
  for (auto args = newArgs.make2ArgsIterator(); args.next != newArgs.end();
       args.advance(newArgs)) {
    if (this->IsKeyword(keyNOT, *args.current)) {
      const auto rhs = this->GetBooleanValueWithAutoDereference(
        *args.next, errorString, status);
      newArgs.ReduceOneArg(!rhs, args);
    }
  }
  return true;
}